

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

bool __thiscall
glcts::GeometryShaderMaxOutputComponentsSinglePointTest::verifyResult
          (GeometryShaderMaxOutputComponentsSinglePointTest *this,void *data)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  bool bVar6;
  GLint expected_value;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar2 = (this->m_n_available_vectors * 4 + 1) * this->m_n_available_vectors * 4 >> 1;
  bVar1 = false;
  lVar3 = 0;
  do {
    lVar5 = 0;
    piVar4 = (int *)data;
    do {
      if (*piVar4 != iVar2) {
        local_1b0._0_8_ =
             ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Wrong result! Expected: ",0x18);
        std::ostream::operator<<(this_00,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Extracted: ",0xc);
        std::ostream::operator<<(this_00,*piVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  X: ",5);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Y: ",4);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        return bVar1;
      }
      lVar5 = lVar5 + 1;
      piVar4 = piVar4 + 4;
    } while (lVar5 == 1);
    data = (void *)((long)data + 0x20);
    bVar6 = lVar3 == 0;
    bVar1 = !bVar6;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  return bVar1;
}

Assistant:

bool GeometryShaderMaxOutputComponentsSinglePointTest::verifyResult(const void* data)
{
	const unsigned char* result_image			= (const unsigned char*)data;
	const unsigned int   line_size				= m_texture_width * m_texture_pixel_size;
	const glw::GLint	 n_components_per_point = m_n_available_vectors * 4; /* 4 components per vector */

	const glw::GLint first_value	= 1;
	const glw::GLint last_value		= n_components_per_point;
	const glw::GLint expected_value = ((first_value + last_value) * n_components_per_point) / 2;

	/* Verify all pixels that belong to point, area m_point_size x m_point_size */
	for (unsigned int y = 0; y < m_point_size; ++y)
	{
		const unsigned int line_offset = y * line_size;

		for (unsigned int x = 0; x < m_point_size; ++x)
		{
			const unsigned int texel_offset = line_offset + x * m_texture_pixel_size;

			if (0 != memcmp(result_image + texel_offset, &expected_value, sizeof(expected_value)))
			{
				const glw::GLint* result_value = (const glw::GLint*)(result_image + texel_offset);

				m_testCtx.getLog() << tcu::TestLog::Message << "Wrong result! Expected: " << expected_value
								   << " Extracted: " << *result_value << "  X: " << x << " Y: " << y
								   << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}